

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
     TraceFixedFieldsAfterSetIsProto
               (DynamicObject *instance,DynamicTypeHandler *oldTypeHandler,
               DynamicTypeHandler *newTypeHandler,DynamicType *oldType,
               RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  undefined8 uVar5;
  undefined8 uVar6;
  char16_t *pcVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  undefined8 *puVar3;
  undefined4 extraout_var_00;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015b6718,FixMethodPropsPhase);
  if ((bVar1) && (DAT_015bc46a == '\x01')) {
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])(oldTypeHandler);
    puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*newTypeHandler->_vptr_DynamicTypeHandler[0x5f])(newTypeHandler);
    puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
    if (puVar3 == (undefined8 *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *puVar3;
    }
    if (puVar4 == (undefined8 *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *puVar4;
    }
    Output::Print(L"   after: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p), new singleton = 0x%p(0x%p)\n"
                  ,(instance->super_RecyclableObject).type.ptr,newTypeHandler,puVar3,uVar6,puVar4,
                  uVar5);
    Output::Print(L"   fixed fields:");
    (*newTypeHandler->_vptr_DynamicTypeHandler[0x5e])(newTypeHandler);
    Output::Print(L"\n");
    Output::Flush();
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015bc490,FixMethodPropsPhase);
  if ((bVar1) && (DAT_015bc46a == '\x01')) {
    pcVar7 = L"changed";
    pcVar8 = L"changed";
    if ((DynamicType *)(instance->super_RecyclableObject).type.ptr == oldType) {
      pcVar8 = L"unchanged";
    }
    pcVar9 = L"!=";
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar9 = L"==";
    }
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])();
    if ((RecyclerWeakReference<Js::DynamicObject> *)CONCAT44(extraout_var_01,iVar2) ==
        oldSingletonInstanceBefore) {
      pcVar7 = L"unchanged";
    }
    Output::Print(L"   type %s, old singleton after %s null (%s)\n",pcVar8,pcVar9,pcVar7);
    Output::Print(L"   fixed fields after:");
    (*newTypeHandler->_vptr_DynamicTypeHandler[0x5e])(newTypeHandler);
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TraceFixedFieldsAfterSetIsProto(
        DynamicObject* instance, DynamicTypeHandler* oldTypeHandler, DynamicTypeHandler* newTypeHandler,
        DynamicType* oldType, RecyclerWeakReference<DynamicObject>* oldSingletonInstanceBefore)
    {
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            RecyclerWeakReference<DynamicObject>* oldSingletonInstanceAfter = oldTypeHandler->GetSingletonInstance();
            RecyclerWeakReference<DynamicObject>* newSingletonInstanceAfter = newTypeHandler->GetSingletonInstance();
            Output::Print(_u("   after: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p), new singleton = 0x%p(0x%p)\n"),
                instance->GetType(), newTypeHandler,
                oldSingletonInstanceAfter, oldSingletonInstanceAfter != nullptr ? oldSingletonInstanceAfter->Get() : nullptr,
                newSingletonInstanceAfter, newSingletonInstanceAfter != nullptr ? newSingletonInstanceAfter->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));
            newTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
            Output::Flush();
        }
        if (PHASE_VERBOSE_TESTTRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("   type %s, old singleton after %s null (%s)\n"),
                oldType != instance->GetType() ? _u("changed") : _u("unchanged"),
                oldSingletonInstanceBefore == nullptr ? _u("==") : _u("!="),
                oldSingletonInstanceBefore != oldTypeHandler->GetSingletonInstance() ? _u("changed") : _u("unchanged"));
            Output::Print(_u("   fixed fields after:"));
            newTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
            Output::Flush();
        }
    }